

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzerSettings.cpp
# Opt level: O2

void __thiscall AsyncRgbLedAnalyzerSettings::InitControllerData(AsyncRgbLedAnalyzerSettings *this)

{
  long lVar1;
  allocator aStack_9b8;
  allocator local_9b7;
  allocator local_9b6;
  allocator local_9b5;
  allocator local_9b4;
  allocator local_9b3;
  allocator local_9b2;
  allocator local_9b1;
  allocator local_9b0;
  allocator local_9af;
  allocator local_9ae;
  allocator local_9ad;
  allocator local_9ac;
  allocator local_9ab;
  allocator local_9aa;
  allocator local_9a9;
  undefined1 local_9a8 [64];
  undefined2 local_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined1 local_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined4 local_880;
  string local_878 [32];
  string local_858 [32];
  undefined2 local_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined1 local_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined4 local_750;
  string local_748 [32];
  string local_728 [32];
  undefined2 local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined1 local_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined4 local_620;
  string local_618 [32];
  string local_5f8 [32];
  undefined2 local_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined1 local_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined4 local_4f0;
  string local_4e8 [32];
  string local_4c8 [32];
  undefined2 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined4 local_3c0;
  string local_3b8 [32];
  string local_398 [32];
  undefined2 local_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined1 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined4 local_290;
  string local_288 [32];
  string local_268 [32];
  undefined2 local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined4 local_160;
  string local_158 [32];
  string local_138 [32];
  undefined2 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  
  std::__cxx11::string::string((string *)local_9a8,"WS2811",&local_9a9);
  std::__cxx11::string::string
            ((string *)(local_9a8 + 0x20),"Worldsemi 24-bit RGB controller",&local_9aa);
  local_968 = 0x308;
  local_960 = 0x3f0a36e2eb1c432c;
  uStack_958 = 0x3f0a36e2eb1c432c;
  local_950 = 0x3f0a36e2eb1c432c;
  uStack_948 = 0x3e977cf447651960;
  local_940 = 0x3ea0c6f7a0b5ed8e;
  uStack_938 = 0x3ea5cf751db94e6b;
  local_930 = 0x3ebf09b082ea2aac;
  uStack_928 = 0x3ec0c6f7a0b5ed8e;
  local_920 = 0x3ec20916fff6c5c5;
  uStack_918 = 0x3eb19db7358bd308;
  local_910 = 0x3eb421f5f40d8377;
  uStack_908 = 0x3eb6a634b28f33e5;
  local_900 = 0x3eb34b365f379dfc;
  uStack_8f8 = 0x3eb5cf751db94e6b;
  local_8f0 = 0x3eb853b3dc3afeda;
  local_8e8 = 1;
  local_8e0 = 0x3e877cf447651960;
  uStack_8d8 = 0x3e90c6f7a0b5ed8e;
  local_8d0 = 0x3e95cf751db94e6b;
  uStack_8c8 = 0x3eaf09b082ea2aac;
  local_8c0 = 0x3eb0c6f7a0b5ed8e;
  uStack_8b8 = 0x3eb20916fff6c5c5;
  local_8b0 = 0x3ea19db7358bd308;
  uStack_8a8 = 0x3ea421f5f40d8377;
  local_8a0 = 0x3ea6a634b28f33e5;
  uStack_898 = 0x3eb48d55be787634;
  local_890 = 0x3eb5cf751db94e6b;
  uStack_888 = 0x3eb711947cfa26a3;
  local_880 = 0;
  std::__cxx11::string::string(local_878,"WS2812B",&local_9ab);
  std::__cxx11::string::string(local_858,"Worldsemi 24-bit RGB integrated light-source",&local_9ac);
  local_838 = 0x308;
  local_830 = 0x3f0a36e2eb1c432c;
  uStack_828 = 0x3f0a36e2eb1c432c;
  local_820 = 0x3f0a36e2eb1c432c;
  uStack_818 = 0x3e8ad7f29abcaf49;
  local_810 = 0x3e9ad7f29abcaf49;
  uStack_808 = 0x3ea27476ca61b882;
  local_800 = 0x3ea77cf447651960;
  uStack_7f8 = 0x3eac8571c4687a3d;
  local_7f0 = 0x3eb19db7358bd308;
  uStack_7e8 = 0x3ea5cf751db94e6b;
  local_7e0 = 0x3eaad7f29abcaf49;
  uStack_7d8 = 0x3eb19db7358bd308;
  local_7d0 = 0x3e8ad7f29abcaf49;
  uStack_7c8 = 0x3e9e32f0ee144532;
  local_7c0 = 0x3ea421f5f40d8377;
  local_7b8 = 0;
  local_7b0 = 0;
  uStack_7a8 = 0;
  local_7a0 = 0;
  uStack_798 = 0;
  local_790 = 0;
  uStack_788 = 0;
  local_780 = 0;
  uStack_778 = 0;
  local_770 = 0;
  uStack_768 = 0;
  local_760 = 0;
  uStack_758 = 0;
  local_750 = 1;
  std::__cxx11::string::string(local_748,"WS2813",&local_9ad);
  std::__cxx11::string::string(local_728,"Worldsemi 24-bit RGB integrated light-source",&local_9ae);
  local_708 = 0x308;
  local_700 = 0x3f0a36e2eb1c432c;
  uStack_6f8 = 0x3f0a36e2eb1c432c;
  local_6f0 = 0x3f0a36e2eb1c432c;
  uStack_6e8 = 0x3e9421f5f40d8377;
  local_6e0 = 0x3e992a737110e454;
  uStack_6d8 = 0x3e9e32f0ee144532;
  local_6d0 = 0x3e9421f5f40d8377;
  uStack_6c8 = 0x3ead5c31593e5fb8;
  local_6c0 = 0x3f1a36e2eb1c432c;
  uStack_6b8 = 0x3ea92a737110e454;
  local_6b0 = 0x3ead5c31593e5fb8;
  uStack_6a8 = 0x3eb0c6f7a0b5ed8e;
  local_6a0 = 0x3e9421f5f40d8377;
  uStack_698 = 0x3e992a737110e454;
  local_690 = 0x3f1a36e2eb1c432c;
  local_688 = 0;
  local_680 = 0;
  uStack_678 = 0;
  local_670 = 0;
  uStack_668 = 0;
  local_660 = 0;
  uStack_658 = 0;
  local_650 = 0;
  uStack_648 = 0;
  local_640 = 0;
  uStack_638 = 0;
  local_630 = 0;
  uStack_628 = 0;
  local_620 = 1;
  std::__cxx11::string::string(local_618,"TM1809",&local_9af);
  std::__cxx11::string::string(local_5f8,"Titan Micro 9-chanel 24-bit RGB controller",&local_9b0);
  local_5d8 = 0x908;
  local_5d0 = 0x3ef92a737110e454;
  uStack_5c8 = 0x3ef92a737110e454;
  local_5c0 = 0x3ff0000000000000;
  uStack_5b8 = 0x3e9e32f0ee144532;
  local_5b0 = 0x3ea421f5f40d8377;
  uStack_5a8 = 0x3ea92a737110e454;
  local_5a0 = 0x3eb19db7358bd308;
  uStack_598 = 0x3eb421f5f40d8377;
  local_590 = 0x3eb6a634b28f33e5;
  uStack_588 = 0x3eb19db7358bd308;
  local_580 = 0x3eb421f5f40d8377;
  uStack_578 = 0x3eb6a634b28f33e5;
  local_570 = 0x3e9e32f0ee144532;
  uStack_568 = 0x3ea421f5f40d8377;
  local_560 = 0x3ea92a737110e454;
  local_558 = 1;
  local_550 = 0x3e90c6f7a0b5ed8e;
  uStack_548 = 0x3e95798ee2308c3a;
  local_540 = 0x3e9a2c2623ab2ae7;
  uStack_538 = 0x3ea1c8aa53503420;
  local_530 = 0x3ea421f5f40d8377;
  uStack_528 = 0x3ea67b4194cad2cd;
  local_520 = 0x3ea1c8aa53503420;
  uStack_518 = 0x3ea421f5f40d8377;
  local_510 = 0x3ea67b4194cad2cd;
  uStack_508 = 0x3e90c6f7a0b5ed8e;
  local_500 = 0x3e95798ee2308c3a;
  uStack_4f8 = 0x3e9a2c2623ab2ae7;
  local_4f0 = 0;
  std::__cxx11::string::string(local_4e8,"TM1804",&local_9b1);
  std::__cxx11::string::string(local_4c8,"Titan Micro 24-bit RGB controller",&local_9b2);
  local_4a8 = 0x308;
  local_4a0 = 0x3ee4f8b588e368f0;
  uStack_498 = 0x3ee4f8b588e368f0;
  local_490 = 0x3ff0000000000000;
  uStack_488 = 0x3eac8571c4687a3d;
  local_480 = 0x3eb0c6f7a0b5ed8d;
  uStack_478 = 0x3eb34b365f379dfc;
  local_470 = 0x3ebf09b082ea2aac;
  uStack_468 = 0x3ec0c6f7a0b5ed8d;
  local_460 = 0x3ec20916fff6c5c5;
  uStack_458 = 0x3ebf09b082ea2aac;
  local_450 = 0x3ec0c6f7a0b5ed8d;
  uStack_448 = 0x3ec20916fff6c5c5;
  local_440 = 0x3eac8571c4687a3d;
  uStack_438 = 0x3eb0c6f7a0b5ed8d;
  local_430 = 0x3eb34b365f379dfc;
  local_428 = 0;
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  uStack_408 = 0;
  local_400 = 0;
  uStack_3f8 = 0;
  local_3f0 = 0;
  uStack_3e8 = 0;
  local_3e0 = 0;
  uStack_3d8 = 0;
  local_3d0 = 0;
  uStack_3c8 = 0;
  local_3c0 = 0;
  std::__cxx11::string::string(local_3b8,"UCS1903",&local_9b3);
  std::__cxx11::string::string(local_398,"UCS1903 24-bit RGB controller",&local_9b4);
  local_378 = 0x308;
  local_370 = 0x3ef92a737110e454;
  uStack_368 = 0x3ef92a737110e454;
  local_360 = 0x3ff0000000000000;
  uStack_358 = 0x3e977cf447651960;
  local_350 = 0x3ea0c6f7a0b5ed8e;
  uStack_348 = 0x3ea5cf751db94e6b;
  local_340 = 0x3ebf09b082ea2aac;
  uStack_338 = 0x3ec0c6f7a0b5ed8e;
  local_330 = 0x3ec20916fff6c5c5;
  uStack_328 = 0x3ebf09b082ea2aac;
  local_320 = 0x3ec0c6f7a0b5ed8e;
  uStack_318 = 0x3ec20916fff6c5c5;
  local_310 = 0x3e977cf447651960;
  uStack_308 = 0x3ea0c6f7a0b5ed8e;
  local_300 = 0x3ea5cf751db94e6b;
  local_2f8 = 1;
  local_2f0 = 0x3e877cf447651960;
  uStack_2e8 = 0x3e90c6f7a0b5ed8e;
  local_2e0 = 0x3e95cf751db94e6b;
  uStack_2d8 = 0x3eaf09b082ea2aac;
  local_2d0 = 0x3eb0c6f7a0b5ed8e;
  uStack_2c8 = 0x3eb20916fff6c5c5;
  local_2c0 = 0x3eaf09b082ea2aac;
  uStack_2b8 = 0x3eb0c6f7a0b5ed8e;
  local_2b0 = 0x3eb20916fff6c5c5;
  uStack_2a8 = 0x3e877cf447651960;
  local_2a0 = 0x3e90c6f7a0b5ed8e;
  uStack_298 = 0x3e95cf751db94e6b;
  local_290 = 0;
  std::__cxx11::string::string(local_288,"LPD1886 - 24 bit",&local_9b5);
  std::__cxx11::string::string(local_268,"LPD1886 RGB controller in 24-bit mode",&local_9b6);
  local_248 = 0x308;
  local_240 = 0x3ef92a737110e454;
  uStack_238 = 0x3eff75104d551d68;
  local_230 = 0x3ff0000000000000;
  uStack_228 = 0x3e8421f5f40d8377;
  local_220 = 0x3e8ad7f29abcaf49;
  uStack_218 = 0x3e92ca5d05ea7ab3;
  local_210 = 0x3ea0c6f7a0b5ed8e;
  uStack_208 = 0x3ea421f5f40d8377;
  local_200 = 0x3ee4f8b588e368f0;
  uStack_1f8 = 0x3e9e32f0ee144532;
  local_1f0 = 0x3ea421f5f40d8377;
  uStack_1e8 = 0x3ee2dfd694ccab3f;
  local_1e0 = 0x3e8421f5f40d8377;
  uStack_1d8 = 0x3e8ad7f29abcaf49;
  local_1d0 = 0x3ee4f8b588e368f0;
  local_1c8 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_190 = 0;
  uStack_188 = 0;
  local_180 = 0;
  uStack_178 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = 0;
  std::__cxx11::string::string(local_158,"LPD1886 - 36 bit",&local_9b7);
  std::__cxx11::string::string(local_138,"LPD1886 RGB controller in 36-bit mode",&aStack_9b8);
  local_118 = 0x30c;
  local_110 = 0x3ef92a737110e454;
  uStack_108 = 0x3eff75104d551d68;
  local_100 = 0x3ff0000000000000;
  uStack_f8 = 0x3e8421f5f40d8377;
  local_f0 = 0x3e8ad7f29abcaf49;
  uStack_e8 = 0x3e92ca5d05ea7ab3;
  local_e0 = 0x3ea0c6f7a0b5ed8e;
  uStack_d8 = 0x3ea421f5f40d8377;
  local_d0 = 0x3ee4f8b588e368f0;
  uStack_c8 = 0x3e9e32f0ee144532;
  local_c0 = 0x3ea421f5f40d8377;
  uStack_b8 = 0x3ee2dfd694ccab3f;
  local_b0 = 0x3e8421f5f40d8377;
  uStack_a8 = 0x3e8ad7f29abcaf49;
  local_a0 = 0x3ee4f8b588e368f0;
  local_98 = 0;
  local_90 = 0;
  uStack_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uStack_38 = 0;
  local_30 = 0;
  std::
  vector<AsyncRgbLedAnalyzerSettings::LedControllerData,std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>>
  ::_M_assign_aux<AsyncRgbLedAnalyzerSettings::LedControllerData_const*>
            ((vector<AsyncRgbLedAnalyzerSettings::LedControllerData,std::allocator<AsyncRgbLedAnalyzerSettings::LedControllerData>>
              *)&this->mControllers,local_9a8);
  lVar1 = 0x850;
  do {
    LedControllerData::~LedControllerData((LedControllerData *)(local_9a8 + lVar1));
    lVar1 = lVar1 + -0x130;
  } while (lVar1 != -0x130);
  return;
}

Assistant:

void AsyncRgbLedAnalyzerSettings::InitControllerData()
{
    // order of values here must correspond to the Controller enum
    mControllers = {
        // name, description, bits per channel, channels per frame, reset time nsec, low-speed data nsec, has high speed, high speed data
        // nsec, color layout

        // https://cdn-shop.adafruit.com/datasheets/WS2811.pdf
        { "WS2811",
          "Worldsemi 24-bit RGB controller",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 350_ns, 500_ns, 650_ns }, { 1850_ns, 2000_ns, 2150_ns } },    // 0-bit times
              { { 1050_ns, 1200_ns, 1350_ns }, { 1150_ns, 1300_ns, 1450_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 175_ns, 250_ns, 325_ns }, { 925_ns, 1000_ns, 1075_ns } }, // 0-bit times
              { { 525_ns, 600_ns, 675_ns }, { 1225_ns, 1300_ns, 1375_ns } } // 1-bit times
          },
          LAYOUT_RGB },
        // https://cdn-shop.adafruit.com/datasheets/WS2812B.pdf
        // http://www.seeedstudio.com/document/pdf/WS2812B%20Datasheet.pdf
        { "WS2812B",
          "Worldsemi 24-bit RGB integrated light-source",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 200_ns, 400_ns, 550_ns }, { 700_ns, 850_ns, 1050_ns } }, // 0-bit times
              { { 650_ns, 800_ns, 1050_ns }, { 200_ns, 450_ns, 600_ns } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_GRB },

        // http://www.led-color.com/upload/201609/WS2813%20LED.pdf
        { "WS2813",
          "Worldsemi 24-bit RGB integrated light-source",
          8,
          3,
          { 50_us, 50_us, 50_us },
          {
              // low-speed times
              { { 300_ns, 375_ns, 450_ns }, { 300_ns, 875_ns, 100_us } },  // 0-bit times
              { { 750_ns, 875_ns, 1000_ns }, { 300_ns, 375_ns, 100_us } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_GRB },

        // https://www.deskontrol.net/descargas/datasheets/TM1809.pdf
        { "TM1809",
          "Titan Micro 9-chanel 24-bit RGB controller",
          8,
          9,
          { 24_us, 24_us, 1.0 },
          {
              // low-speed times
              { { 450_ns, 600_ns, 750_ns }, { 1050_ns, 1200_ns, 1350_ns } }, // 0-bit times
              { { 1050_ns, 1200_ns, 1350_ns }, { 450_ns, 600_ns, 750_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 250_ns, 320_ns, 390_ns }, { 530_ns, 600_ns, 670_ns } }, // 0-bit times
              { { 530_ns, 600_ns, 670_ns }, { 250_ns, 320_ns, 390_ns } }  // 1-bit times
          },
          LAYOUT_RGB },

        // https://www.deskontrol.net/descargas/datasheets/TM1804.pdf
        { "TM1804",
          "Titan Micro 24-bit RGB controller",
          8,
          3,
          { 10_us, 10_us, 1.0 },
          {
              // low-speed times
              { { 850_ns, 1_us, 1150_ns }, { 1850_ns, 2_us, 2150_ns } }, // 0-bit times
              { { 1850_ns, 2_us, 2150_ns }, { 850_ns, 1_us, 1150_ns } }, // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },

        // http://www.bestlightingbuy.com/pdf/UCS1903%20datasheet.pdf
        { "UCS1903",
          "UCS1903 24-bit RGB controller",
          8,
          3,
          { 24_us, 24_us, 1.0 },
          {
              // low-speed times
              { { 350_ns, 500_ns, 650_ns }, { 1850_ns, 2000_ns, 2150_ns } }, // 0-bit times
              { { 1850_ns, 2000_ns, 2150_ns }, { 350_ns, 500_ns, 650_ns } }, // 1-bit times
          },
          true,
          {
              // high-speed times
              { { 175_ns, 250_ns, 325_ns }, { 925_ns, 1000_ns, 1075_ns } }, // 0-bit times
              { { 925_ns, 1000_ns, 1075_ns }, { 175_ns, 250_ns, 325_ns } }  // 1-bit times
          },
          LAYOUT_RGB },

        // https://www.syncrolight.co.uk/datasheets/LPD1886%20datasheet.pdf
        { "LPD1886 - 24 bit",
          "LPD1886 RGB controller in 24-bit mode",
          8,
          3,
          { 24_us, 30_us, 1.0 },
          {
              // low-speed times
              { { 150_ns, 200_ns, 280_ns }, { 500_ns, 600_ns, 10_us } }, // 0-bit times
              { { 450_ns, 600_ns, 9_us }, { 150_ns, 200_ns, 10_us } },   // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },

        { "LPD1886 - 36 bit",
          "LPD1886 RGB controller in 36-bit mode",
          12,
          3,
          { 24_us, 30_us, 1.0 },
          {
              // low-speed times
              { { 150_ns, 200_ns, 280_ns }, { 500_ns, 600_ns, 10_us } }, // 0-bit times
              { { 450_ns, 600_ns, 9_us }, { 150_ns, 200_ns, 10_us } },   // 1-bit times
          },
          false,
          { {}, {} },
          LAYOUT_RGB },
    };
}